

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Path> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  Path v;
  Path local_100;
  
  bVar5 = MaybeNone(this);
  if (bVar5) {
    if (value->has_value_ == true) {
      Path::~Path((Path *)&value->contained);
    }
    value->has_value_ = false;
    bVar5 = true;
  }
  else {
    local_100._prim_part._M_dataplus._M_p = (pointer)&local_100._prim_part.field_2;
    local_100._prim_part._M_string_length = 0;
    local_100._prim_part.field_2._M_local_buf[0] = '\0';
    local_100._prop_part._M_dataplus._M_p = (pointer)&local_100._prop_part.field_2;
    local_100._prop_part._M_string_length = 0;
    local_100._prop_part.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_100._variant_part.field_2;
    local_100._variant_part._M_string_length = 0;
    local_100._variant_part.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_100._variant_selection_part.field_2;
    local_100._variant_selection_part._M_string_length = 0;
    local_100._variant_selection_part.field_2._M_local_buf[0] = '\0';
    paVar3 = &local_100._variant_part_str.field_2;
    local_100._variant_part_str._M_string_length = 0;
    local_100._variant_part_str.field_2._M_local_buf[0] = '\0';
    paVar4 = &local_100._element.field_2;
    local_100._element._M_string_length = 0;
    local_100._element.field_2._M_local_buf[0] = '\0';
    local_100._path_type.has_value_ = false;
    local_100._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_100._valid = false;
    local_100._variant_part._M_dataplus._M_p = (pointer)paVar1;
    local_100._variant_selection_part._M_dataplus._M_p = (pointer)paVar2;
    local_100._variant_part_str._M_dataplus._M_p = (pointer)paVar3;
    local_100._element._M_dataplus._M_p = (pointer)paVar4;
    bVar5 = ReadBasicType(this,&local_100);
    if (bVar5) {
      nonstd::optional_lite::optional<tinyusdz::Path>::operator=(value,&local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._element._M_dataplus._M_p != paVar4) {
      operator_delete(local_100._element._M_dataplus._M_p,
                      CONCAT71(local_100._element.field_2._M_allocated_capacity._1_7_,
                               local_100._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._variant_part_str._M_dataplus._M_p != paVar3) {
      operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_100._variant_part_str.field_2._M_allocated_capacity._1_7_,
                               local_100._variant_part_str.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._variant_selection_part._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_100._variant_selection_part.field_2._M_allocated_capacity._1_7_
                               ,local_100._variant_selection_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._variant_part._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._variant_part._M_dataplus._M_p,
                      CONCAT71(local_100._variant_part.field_2._M_allocated_capacity._1_7_,
                               local_100._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
      operator_delete(local_100._prop_part._M_dataplus._M_p,
                      CONCAT71(local_100._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_100._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
      operator_delete(local_100._prim_part._M_dataplus._M_p,
                      CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_100._prim_part.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar5;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Path> *value) {

  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Path v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}